

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromBarBufs(Abc_Ntk_t *pNtkBase,Abc_Ntk_t *pNtk)

{
  uint uVar1;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar2;
  Nm_Man_t *pNVar3;
  int iVar4;
  int iVar5;
  Abc_Des_t *pAVar6;
  Abc_Ntk_t *pAVar7;
  Abc_Obj_t *pAVar8;
  void *pvVar9;
  void *pvVar10;
  Abc_Obj_t *pAVar11;
  char *pcVar12;
  void *local_78;
  int local_58;
  int local_54;
  int k;
  int i;
  Abc_Obj_t *pLoMap;
  Abc_Obj_t *pLiMap;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vLoMaps;
  Vec_Ptr_t *vLiMaps;
  Abc_Ntk_t *pTemp;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  Abc_Ntk_t *pNtkBase_local;
  
  pNtkNew = pNtk;
  pNtk_local = pNtkBase;
  if (pNtkBase->pDesign == (Abc_Des_t *)0x0) {
    __assert_fail("pNtkBase->pDesign != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,0x10d,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar4 = Abc_NtkIsNetlist(pNtk);
  if (iVar4 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,0x10e,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar4 = Abc_NtkIsNetlist(pNtk_local);
  if (iVar4 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtkBase)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,0x10f,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar4 = Abc_NtkLatchNum(pNtk_local);
  if (iVar4 != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtkBase) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,0x110,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar4 = Abc_NtkLatchNum(pNtkNew);
  if (iVar4 != pNtkNew->nBarBufs) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == pNtk->nBarBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,0x111,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar4 = Abc_NtkWhiteboxNum(pNtkNew);
  if (iVar4 != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,0x112,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar4 = Abc_NtkBlackboxNum(pNtkNew);
  if (iVar4 != 0) {
    __assert_fail("Abc_NtkBlackboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,0x113,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar4 = Abc_NtkPiNum(pNtkNew);
  iVar5 = Abc_NtkPiNum(pNtk_local);
  if (iVar4 == iVar5) {
    iVar4 = Abc_NtkPoNum(pNtkNew);
    iVar5 = Abc_NtkPoNum(pNtk_local);
    if (iVar4 != iVar5) {
      __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                    ,0x115,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    Abc_NtkCleanCopy_rec(pNtk_local);
    for (local_54 = 0; iVar4 = Vec_PtrSize(pNtk_local->pDesign->vModules), local_54 < iVar4;
        local_54 = local_54 + 1) {
      vLiMaps = (Vec_Ptr_t *)Vec_PtrEntry(pNtk_local->pDesign->vModules,local_54);
      pAVar7 = Abc_NtkStartFrom((Abc_Ntk_t *)vLiMaps,pNtkNew->ntkType,pNtkNew->ntkFunc);
      *(Abc_Ntk_t **)(vLiMaps + 0x16) = pAVar7;
    }
    for (local_54 = 0; iVar4 = Vec_PtrSize(pNtk_local->pDesign->vModules), local_54 < iVar4;
        local_54 = local_54 + 1) {
      vLiMaps = (Vec_Ptr_t *)Vec_PtrEntry(pNtk_local->pDesign->vModules,local_54);
      if (vLiMaps[0xb].pArray == (void **)0x0) {
        local_78 = (void *)0x0;
      }
      else {
        local_78 = vLiMaps[0xb].pArray[0x2c];
      }
      *(void **)(*(long *)(vLiMaps + 0x16) + 0xb8) = local_78;
    }
    for (local_54 = 0; iVar4 = Vec_PtrSize(pNtk_local->pDesign->vModules), local_54 < iVar4;
        local_54 = local_54 + 1) {
      vLiMaps = (Vec_Ptr_t *)Vec_PtrEntry(pNtk_local->pDesign->vModules,local_54);
      for (local_58 = 0; iVar4 = Vec_PtrSize(*(Vec_Ptr_t **)(vLiMaps + 5)), local_58 < iVar4;
          local_58 = local_58 + 1) {
        pAVar8 = Abc_NtkBox((Abc_Ntk_t *)vLiMaps,local_58);
        iVar4 = Abc_ObjIsWhitebox(pAVar8);
        if ((iVar4 != 0) || (iVar4 = Abc_ObjIsBlackbox(pAVar8), iVar4 != 0)) {
          pAVar7 = Abc_ObjModel(pAVar8);
          ((pAVar8->field_6).pCopy)->field_5 =
               (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)pAVar7->pCopy;
        }
      }
    }
    pTemp = pNtk_local->pCopy;
    pAVar6 = Abc_DesCreate(pNtk_local->pDesign->pName);
    pTemp->pDesign = pAVar6;
    for (local_54 = 0; iVar4 = Vec_PtrSize(pNtk_local->pDesign->vModules), local_54 < iVar4;
        local_54 = local_54 + 1) {
      vLiMaps = (Vec_Ptr_t *)Vec_PtrEntry(pNtk_local->pDesign->vModules,local_54);
      Abc_DesAddModel(pTemp->pDesign,*(Abc_Ntk_t **)(vLiMaps + 0x16));
    }
    for (local_54 = 0; iVar4 = Vec_PtrSize(pNtk_local->pDesign->vTops), local_54 < iVar4;
        local_54 = local_54 + 1) {
      vLiMaps = (Vec_Ptr_t *)Vec_PtrEntry(pNtk_local->pDesign->vTops,local_54);
      Vec_PtrPush(pTemp->pDesign->vTops,*(void **)(vLiMaps + 0x16));
    }
    pAVar7 = (Abc_Ntk_t *)Vec_PtrEntry(pTemp->pDesign->vTops,0);
    if (pAVar7 == pTemp) {
      Abc_NtkCleanCopy(pNtkNew);
      for (local_54 = 0; iVar4 = Abc_NtkPiNum(pNtkNew), local_54 < iVar4; local_54 = local_54 + 1) {
        pAVar8 = Abc_NtkPi(pNtkNew,local_54);
        pAVar11 = Abc_NtkPi(pTemp,local_54);
        (pAVar8->field_6).pCopy = pAVar11;
      }
      for (local_54 = 0; iVar4 = Abc_NtkPoNum(pNtkNew), local_54 < iVar4; local_54 = local_54 + 1) {
        pAVar8 = Abc_NtkPo(pNtkNew,local_54);
        pAVar11 = Abc_NtkPo(pTemp,local_54);
        (pAVar8->field_6).pCopy = pAVar11;
      }
      Abc_NtkCollectPiPos(pNtk_local,&vLoMaps,(Vec_Ptr_t **)&pObj);
      iVar4 = Vec_PtrSize(vLoMaps);
      iVar5 = Abc_NtkLatchNum(pNtkNew);
      if (iVar4 != iVar5) {
        __assert_fail("Vec_PtrSize(vLiMaps) == Abc_NtkLatchNum(pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                      ,0x130,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      iVar4 = Vec_PtrSize((Vec_Ptr_t *)pObj);
      iVar5 = Abc_NtkLatchNum(pNtkNew);
      if (iVar4 != iVar5) {
        __assert_fail("Vec_PtrSize(vLoMaps) == Abc_NtkLatchNum(pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                      ,0x131,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      for (local_54 = 0; iVar4 = Vec_PtrSize(vLoMaps), local_54 < iVar4; local_54 = local_54 + 1) {
        pvVar9 = Vec_PtrEntry(vLoMaps,local_54);
        pvVar10 = Vec_PtrEntry((Vec_Ptr_t *)pObj,local_54);
        pAVar8 = Abc_NtkBox(pNtkNew,local_54);
        aVar2 = *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)((long)pvVar9 + 0x40);
        pAVar11 = Abc_ObjFanin0(pAVar8);
        pAVar11->field_6 = aVar2;
        aVar2 = *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)((long)pvVar10 + 0x40);
        pAVar8 = Abc_ObjFanout0(pAVar8);
        pAVar8->field_6 = aVar2;
      }
      Vec_PtrFree(vLoMaps);
      Vec_PtrFree((Vec_Ptr_t *)pObj);
      for (local_54 = 0; iVar4 = Abc_NtkCoNum(pNtkNew), local_54 < iVar4; local_54 = local_54 + 1) {
        pAVar11 = Abc_NtkCo(pNtkNew,local_54);
        pAVar8 = (pAVar11->field_6).pCopy;
        pAVar7 = ((pAVar11->field_6).pCopy)->pNtk;
        pAVar11 = Abc_ObjFanin0(pAVar11);
        pAVar11 = Abc_NtkFromBarBufs_rec(pAVar7,pAVar11);
        Abc_ObjAddFanin(pAVar8,pAVar11);
      }
      for (local_54 = 0; iVar4 = Abc_NtkCiNum(pNtkNew), local_54 < iVar4; local_54 = local_54 + 1) {
        pAVar8 = Abc_NtkCi(pNtkNew,local_54);
        iVar4 = Abc_ObjFanoutNum((pAVar8->field_6).pCopy);
        if (iVar4 == 0) {
          pAVar11 = Abc_NtkCreateNet(((pAVar8->field_6).pCopy)->pNtk);
          Abc_ObjAddFanin(pAVar11,(pAVar8->field_6).pCopy);
        }
        pNVar3 = ((pAVar8->field_6).pCopy)->pNtk->pManName;
        pAVar11 = Abc_ObjFanout0((pAVar8->field_6).pCopy);
        iVar4 = pAVar11->Id;
        pAVar11 = Abc_ObjFanout0((pAVar8->field_6).pCopy);
        uVar1 = *(uint *)&pAVar11->field_0x14;
        pAVar8 = Abc_ObjFanout0(pAVar8);
        pcVar12 = Abc_ObjName(pAVar8);
        Nm_ManStoreIdName(pNVar3,iVar4,uVar1 & 0xf,pcVar12,(char *)0x0);
      }
      for (local_54 = 0; iVar4 = Abc_NtkCoNum(pNtkNew), local_54 < iVar4; local_54 = local_54 + 1) {
        pAVar8 = Abc_NtkCo(pNtkNew,local_54);
        pNVar3 = ((pAVar8->field_6).pCopy)->pNtk->pManName;
        pAVar11 = Abc_ObjFanin0((pAVar8->field_6).pCopy);
        iVar4 = pAVar11->Id;
        pAVar11 = Abc_ObjFanin0((pAVar8->field_6).pCopy);
        uVar1 = *(uint *)&pAVar11->field_0x14;
        pAVar8 = Abc_ObjFanin0(pAVar8);
        pcVar12 = Abc_ObjName(pAVar8);
        Nm_ManStoreIdName(pNVar3,iVar4,uVar1 & 0xf,pcVar12,(char *)0x0);
      }
      return pTemp;
    }
    __assert_fail("Vec_PtrEntry(pNtkNew->pDesign->vTops, 0) == pNtkNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,0x128,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkBase)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                ,0x114,"Abc_Ntk_t *Abc_NtkFromBarBufs(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromBarBufs( Abc_Ntk_t * pNtkBase, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew, * pTemp;
    Vec_Ptr_t * vLiMaps, * vLoMaps;
    Abc_Obj_t * pObj, * pLiMap, * pLoMap;
    int i, k;
    assert( pNtkBase->pDesign != NULL );
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkIsNetlist(pNtkBase) );
    assert( Abc_NtkLatchNum(pNtkBase) == 0 );
    assert( Abc_NtkLatchNum(pNtk) == pNtk->nBarBufs );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    assert( Abc_NtkBlackboxNum(pNtk) == 0 );
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkBase) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkBase) );
    // start networks
    Abc_NtkCleanCopy_rec( pNtkBase );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        pTemp->pCopy = Abc_NtkStartFrom( pTemp, pNtk->ntkType, pNtk->ntkFunc );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        pTemp->pCopy->pAltView = pTemp->pAltView ? pTemp->pAltView->pCopy : NULL;
    // update box models
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        Abc_NtkForEachBox( pTemp, pObj, k )
            if ( Abc_ObjIsWhitebox(pObj) || Abc_ObjIsBlackbox(pObj) )
                pObj->pCopy->pData = Abc_ObjModel(pObj)->pCopy;
    // create the design
    pNtkNew = pNtkBase->pCopy;
    pNtkNew->pDesign = Abc_DesCreate( pNtkBase->pDesign->pName );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vModules, pTemp, i )
        Abc_DesAddModel( pNtkNew->pDesign, pTemp->pCopy );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkBase->pDesign->vTops, pTemp, i )
        Vec_PtrPush( pNtkNew->pDesign->vTops, pTemp->pCopy );
    assert( Vec_PtrEntry(pNtkNew->pDesign->vTops, 0) == pNtkNew );
    // transfer copy attributes to pNtk
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkPi(pNtkNew, i);
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->pCopy = Abc_NtkPo(pNtkNew, i);
    Abc_NtkCollectPiPos( pNtkBase, &vLiMaps, &vLoMaps );
    assert( Vec_PtrSize(vLiMaps) == Abc_NtkLatchNum(pNtk) );
    assert( Vec_PtrSize(vLoMaps) == Abc_NtkLatchNum(pNtk) );
    Vec_PtrForEachEntryTwo( Abc_Obj_t *, vLiMaps, Abc_Obj_t *, vLoMaps, pLiMap, pLoMap, i )
    {
        pObj = Abc_NtkBox( pNtk, i );
        Abc_ObjFanin0(pObj)->pCopy = pLiMap->pCopy; 
        Abc_ObjFanout0(pObj)->pCopy = pLoMap->pCopy; 
    }
    Vec_PtrFree( vLiMaps );
    Vec_PtrFree( vLoMaps );
    // create internal nodes
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_NtkFromBarBufs_rec(pObj->pCopy->pNtk, Abc_ObjFanin0(pObj)) );
    // transfer net names
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( Abc_ObjFanoutNum(pObj->pCopy) == 0 ) // handle PI without fanout
            Abc_ObjAddFanin( Abc_NtkCreateNet(pObj->pCopy->pNtk), pObj->pCopy );
        Nm_ManStoreIdName( pObj->pCopy->pNtk->pManName, Abc_ObjFanout0(pObj->pCopy)->Id, Abc_ObjFanout0(pObj->pCopy)->Type, Abc_ObjName(Abc_ObjFanout0(pObj)), NULL );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        Nm_ManStoreIdName( pObj->pCopy->pNtk->pManName, Abc_ObjFanin0(pObj->pCopy)->Id, Abc_ObjFanin0(pObj->pCopy)->Type, Abc_ObjName(Abc_ObjFanin0(pObj)), NULL );
    return pNtkNew;
}